

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O3

Code * __thiscall md::Code::not_to_dx(Code *this,DataRegister *reg,Size size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uchar *puVar4;
  uchar local_41;
  uchar local_40;
  undefined7 uStack_3f;
  uchar *local_38;
  long local_30;
  
  uVar3 = 0x4640;
  if (size != WORD) {
    uVar3 = (uint)(size == LONG) << 7 | 0x4600;
  }
  iVar1 = (*(reg->super_Register).super_Param._vptr_Param[1])(reg);
  iVar2 = (**(reg->super_Register).super_Param._vptr_Param)(reg);
  iVar2 = uVar3 + iVar1 * 8 + iVar2;
  local_40 = (uchar)((uint)iVar2 >> 8);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  local_40 = (uchar)iVar2;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_40);
  (*(reg->super_Register).super_Param._vptr_Param[2])(&local_40,reg);
  puVar4 = (uchar *)CONCAT71(uStack_3f,local_40);
  if (puVar4 != local_38) {
    do {
      local_41 = *puVar4;
      std::vector<unsigned_char,std::allocator<unsigned_char>>::emplace_back<unsigned_char&>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)this,&local_41);
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_38);
    puVar4 = (uchar *)CONCAT71(uStack_3f,local_40);
  }
  if (puVar4 != (uchar *)0x0) {
    operator_delete(puVar4,local_30 - (long)puVar4);
  }
  return this;
}

Assistant:

Code& Code::not_to_dx(const DataRegister& reg, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0x4600 + (size_code << 6) + reg.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(reg.getAdditionnalData());

    return *this;
}